

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O2

Constant * __thiscall
spvtools::opt::analysis::ConstantManager::GetNumericVectorConstantWithWords
          (ConstantManager *this,Vector *type,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *literal_words)

{
  Type *pTVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Constant *c;
  Instruction *this_00;
  Constant *pCVar5;
  undefined4 extraout_var_01;
  pointer puVar6;
  uint32_t i;
  ulong uVar7;
  uint uVar8;
  uint32_t element_id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> const_data;
  vector<unsigned_int,_std::allocator<unsigned_int>_> element_ids;
  uint32_t local_7c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_78;
  Type *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  long lVar4;
  
  pTVar1 = type->element_type_;
  local_78 = literal_words;
  iVar2 = (*pTVar1->_vptr_Type[0xc])(pTVar1);
  lVar4 = CONCAT44(extraout_var,iVar2);
  if (lVar4 == 0) {
    iVar2 = (*pTVar1->_vptr_Type[10])(pTVar1);
    lVar4 = CONCAT44(extraout_var_00,iVar2);
    if (lVar4 == 0) {
      iVar2 = (*pTVar1->_vptr_Type[8])(pTVar1);
      uVar8 = (uint)(CONCAT44(extraout_var_01,iVar2) != 0);
      goto LAB_0049a1aa;
    }
  }
  uVar8 = *(uint *)(lVar4 + 0x24) >> 5;
LAB_0049a1aa:
  if (uVar8 - 3 < 0xfffffffe) {
    pCVar5 = (Constant *)0x0;
  }
  else {
    uVar3 = type->count_;
    pCVar5 = (Constant *)0x0;
    if (uVar3 * uVar8 ==
        (int)((ulong)((long)(local_78->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_finish -
                     (long)(local_78->
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                           super__Vector_impl_data._M_start) >> 2)) {
      local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_70 = pTVar1;
      for (uVar7 = 0; uVar7 < uVar3; uVar7 = uVar7 + 1) {
        puVar6 = (local_78->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_start + (long)pCVar5;
        local_68 = 0;
        uStack_60 = 0;
        local_58 = 0;
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_range_initialize<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_68,puVar6,
                   puVar6 + uVar8);
        c = GetConstant(this,local_70,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68);
        this_00 = GetDefiningInstruction(this,c,0,(inst_iterator *)0x0);
        local_7c = Instruction::result_id(this_00);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&local_7c);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68);
        uVar3 = type->count_;
        pCVar5 = (Constant *)(ulong)((int)pCVar5 + uVar8);
      }
      pCVar5 = GetConstant(this,&type->super_Type,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
    }
  }
  return pCVar5;
}

Assistant:

const Constant* ConstantManager::GetNumericVectorConstantWithWords(
    const Vector* type, const std::vector<uint32_t>& literal_words) {
  const auto* element_type = type->element_type();
  uint32_t words_per_element = 0;
  if (const auto* float_type = element_type->AsFloat())
    words_per_element = float_type->width() / 32;
  else if (const auto* int_type = element_type->AsInteger())
    words_per_element = int_type->width() / 32;
  else if (element_type->AsBool() != nullptr)
    words_per_element = 1;

  if (words_per_element != 1 && words_per_element != 2) return nullptr;

  if (words_per_element * type->element_count() !=
      static_cast<uint32_t>(literal_words.size())) {
    return nullptr;
  }

  std::vector<uint32_t> element_ids;
  for (uint32_t i = 0; i < type->element_count(); ++i) {
    auto first_word = literal_words.begin() + (words_per_element * i);
    std::vector<uint32_t> const_data(first_word,
                                     first_word + words_per_element);
    const analysis::Constant* element_constant =
        GetConstant(element_type, const_data);
    auto element_id = GetDefiningInstruction(element_constant)->result_id();
    element_ids.push_back(element_id);
  }

  return GetConstant(type, element_ids);
}